

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  Scene *pSVar2;
  float **ppfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [32];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  int iVar19;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  byte bVar24;
  ulong uVar25;
  size_t sVar26;
  ulong uVar27;
  long lVar28;
  ulong unaff_R13;
  size_t mask;
  Scene *scene;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar33 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined4 uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  float fVar58;
  undefined1 auVar59 [32];
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar60 [64];
  undefined1 auVar64 [16];
  uint uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  uint uVar68;
  uint uVar69;
  uint uVar70;
  undefined1 in_ZMM8 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 local_2678 [16];
  ulong local_2668;
  ulong local_2660;
  ulong local_2658;
  StackItemT<embree::NodeRefPtr<8>_> *local_2650;
  ulong local_2648;
  ulong local_2640;
  ulong local_2638;
  long local_2630;
  RTCFilterFunctionNArguments args;
  undefined8 local_25f8;
  undefined8 uStack_25f0;
  undefined1 local_25e8 [16];
  undefined1 local_25d8 [16];
  undefined1 local_25c8 [16];
  undefined1 local_25b8 [16];
  byte local_25a7;
  float local_2598 [4];
  float local_2588 [4];
  undefined1 local_2578 [16];
  undefined1 local_2568 [16];
  undefined1 local_2558 [16];
  undefined1 local_2548 [16];
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined8 local_2518;
  undefined8 uStack_2510;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  local_2650 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  auVar47 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar72 = ZEXT3264(auVar47);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar73 = ZEXT3264(auVar48);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar74 = ZEXT3264(auVar49);
  auVar33 = vmulss_avx512f(auVar47._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar54 = auVar33._0_4_;
  auVar47._4_4_ = uVar54;
  auVar47._0_4_ = uVar54;
  auVar47._8_4_ = uVar54;
  auVar47._12_4_ = uVar54;
  auVar47._16_4_ = uVar54;
  auVar47._20_4_ = uVar54;
  auVar47._24_4_ = uVar54;
  auVar47._28_4_ = uVar54;
  auVar33 = vmulss_avx512f(auVar48._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar54 = auVar33._0_4_;
  auVar48._4_4_ = uVar54;
  auVar48._0_4_ = uVar54;
  auVar48._8_4_ = uVar54;
  auVar48._12_4_ = uVar54;
  auVar48._16_4_ = uVar54;
  auVar48._20_4_ = uVar54;
  auVar48._24_4_ = uVar54;
  auVar48._28_4_ = uVar54;
  auVar33 = vmulss_avx512f(auVar49._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar54 = auVar33._0_4_;
  auVar49._4_4_ = uVar54;
  auVar49._0_4_ = uVar54;
  auVar49._8_4_ = uVar54;
  auVar49._12_4_ = uVar54;
  auVar49._16_4_ = uVar54;
  auVar49._20_4_ = uVar54;
  auVar49._24_4_ = uVar54;
  auVar49._28_4_ = uVar54;
  local_2658 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_2660 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_2638 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2640 = local_2658 ^ 0x20;
  uVar29 = local_2660 ^ 0x20;
  local_2648 = local_2638 ^ 0x20;
  iVar22 = (tray->tfar).field_0.i[k];
  auVar57 = ZEXT3264(CONCAT428(iVar22,CONCAT424(iVar22,CONCAT420(iVar22,CONCAT416(iVar22,CONCAT412(
                                                  iVar22,CONCAT48(iVar22,CONCAT44(iVar22,iVar22)))))
                                               )));
  auVar50._8_4_ = 0x80000000;
  auVar50._0_8_ = 0x8000000080000000;
  auVar50._12_4_ = 0x80000000;
  auVar50._16_4_ = 0x80000000;
  auVar50._20_4_ = 0x80000000;
  auVar50._24_4_ = 0x80000000;
  auVar50._28_4_ = 0x80000000;
  auVar47 = vxorps_avx512vl(auVar47,auVar50);
  auVar75 = ZEXT3264(auVar47);
  auVar47 = vxorps_avx512vl(auVar48,auVar50);
  auVar76 = ZEXT3264(auVar47);
  auVar47 = vxorps_avx512vl(auVar49,auVar50);
  auVar77 = ZEXT3264(auVar47);
  auVar47 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar78 = ZEXT3264(auVar47);
  auVar33 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar79 = ZEXT1664(auVar33);
  auVar47 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar80 = ZEXT3264(auVar47);
  auVar47 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar81 = ZEXT3264(auVar47);
  auVar33 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
  auVar82 = ZEXT1664(auVar33);
  auVar47 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
  auVar83 = ZEXT3264(auVar47);
  auVar47 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
  auVar84 = ZEXT3264(auVar47);
  uVar27 = local_2638;
  uVar31 = local_2640;
  uVar32 = local_2648;
  do {
    do {
      do {
        if (local_2650 == stack) {
          return;
        }
        pSVar20 = local_2650 + -1;
        local_2650 = local_2650 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < (float)pSVar20->dist);
      sVar26 = (local_2650->ptr).ptr;
      do {
        if ((sVar26 & 8) == 0) {
          auVar47 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar26 + 0x40 + local_2658),auVar75._0_32_,
                               auVar72._0_32_);
          auVar48 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar26 + 0x40 + local_2660),auVar76._0_32_,
                               auVar73._0_32_);
          auVar47 = vpmaxsd_avx2(auVar47,auVar48);
          auVar48 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar26 + 0x40 + uVar27),auVar77._0_32_,
                               auVar74._0_32_);
          auVar48 = vpmaxsd_avx512vl(auVar48,auVar78._0_32_);
          auVar47 = vpmaxsd_avx2(auVar47,auVar48);
          in_ZMM8 = ZEXT3264(auVar47);
          auVar48 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar26 + 0x40 + uVar31),auVar75._0_32_,
                               auVar72._0_32_);
          auVar49 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar26 + 0x40 + uVar29),auVar76._0_32_,
                               auVar73._0_32_);
          auVar48 = vpminsd_avx2(auVar48,auVar49);
          auVar49 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar26 + 0x40 + uVar32),auVar77._0_32_,
                               auVar74._0_32_);
          auVar49 = vpminsd_avx2(auVar49,auVar57._0_32_);
          auVar48 = vpminsd_avx2(auVar48,auVar49);
          uVar17 = vpcmpd_avx512vl(auVar47,auVar48,2);
          unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),(uint)(byte)uVar17);
        }
        if ((sVar26 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar22 = 4;
          }
          else {
            auVar47 = *(undefined1 (*) [32])(sVar26 & 0xfffffffffffffff0);
            auVar48 = ((undefined1 (*) [32])(sVar26 & 0xfffffffffffffff0))[1];
            auVar49 = vmovdqa64_avx512vl(auVar80._0_32_);
            auVar67 = in_ZMM8._0_32_;
            auVar49 = vpternlogd_avx512vl(auVar49,auVar67,auVar81._0_32_,0xf8);
            uVar30 = unaff_R13 & 0xffffffff;
            auVar50 = vpcompressd_avx512vl(auVar49);
            bVar12 = (bool)((byte)uVar30 & 1);
            auVar52._0_4_ = (uint)bVar12 * auVar50._0_4_ | (uint)!bVar12 * auVar49._0_4_;
            bVar12 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar52._4_4_ = (uint)bVar12 * auVar50._4_4_ | (uint)!bVar12 * auVar49._4_4_;
            bVar12 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar52._8_4_ = (uint)bVar12 * auVar50._8_4_ | (uint)!bVar12 * auVar49._8_4_;
            bVar12 = (bool)((byte)(uVar30 >> 3) & 1);
            auVar52._12_4_ = (uint)bVar12 * auVar50._12_4_ | (uint)!bVar12 * auVar49._12_4_;
            bVar12 = (bool)((byte)(uVar30 >> 4) & 1);
            auVar52._16_4_ = (uint)bVar12 * auVar50._16_4_ | (uint)!bVar12 * auVar49._16_4_;
            bVar12 = (bool)((byte)(uVar30 >> 5) & 1);
            auVar52._20_4_ = (uint)bVar12 * auVar50._20_4_ | (uint)!bVar12 * auVar49._20_4_;
            bVar12 = (bool)((byte)(uVar30 >> 6) & 1);
            auVar52._24_4_ = (uint)bVar12 * auVar50._24_4_ | (uint)!bVar12 * auVar49._24_4_;
            bVar12 = (bool)((byte)(uVar30 >> 7) & 1);
            auVar52._28_4_ = (uint)bVar12 * auVar50._28_4_ | (uint)!bVar12 * auVar49._28_4_;
            auVar49 = vpermt2q_avx512vl(auVar47,auVar52,auVar48);
            sVar26 = auVar49._0_8_;
            iVar21 = 0;
            uVar30 = unaff_R13 - 1 & unaff_R13;
            iVar22 = 0;
            if (uVar30 != 0) {
              auVar49 = vpshufd_avx2(auVar52,0x55);
              vpermt2q_avx512vl(auVar47,auVar49,auVar48);
              auVar50 = vpminsd_avx2(auVar52,auVar49);
              auVar49 = vpmaxsd_avx2(auVar52,auVar49);
              uVar30 = uVar30 - 1 & uVar30;
              iVar22 = iVar21;
              if (uVar30 == 0) {
                auVar50 = vpermi2q_avx512vl(auVar50,auVar47,auVar48);
                sVar26 = auVar50._0_8_;
                auVar47 = vpermt2q_avx512vl(auVar47,auVar49,auVar48);
                (local_2650->ptr).ptr = auVar47._0_8_;
                auVar47 = vpermd_avx2(auVar49,auVar67);
                local_2650->dist = auVar47._0_4_;
                local_2650 = local_2650 + 1;
              }
              else {
                auVar59 = vpshufd_avx2(auVar52,0xaa);
                vpermt2q_avx512vl(auVar47,auVar59,auVar48);
                auVar53 = vpminsd_avx2(auVar50,auVar59);
                auVar50 = vpmaxsd_avx2(auVar50,auVar59);
                auVar59 = vpminsd_avx2(auVar49,auVar50);
                auVar49 = vpmaxsd_avx2(auVar49,auVar50);
                uVar30 = uVar30 - 1 & uVar30;
                if (uVar30 == 0) {
                  auVar50 = vpermi2q_avx512vl(auVar53,auVar47,auVar48);
                  sVar26 = auVar50._0_8_;
                  auVar50 = vpermt2q_avx512vl(auVar47,auVar49,auVar48);
                  (local_2650->ptr).ptr = auVar50._0_8_;
                  auVar49 = vpermd_avx2(auVar49,auVar67);
                  local_2650->dist = auVar49._0_4_;
                  auVar47 = vpermt2q_avx512vl(auVar47,auVar59,auVar48);
                  local_2650[1].ptr.ptr = auVar47._0_8_;
                  auVar47 = vpermd_avx2(auVar59,auVar67);
                  local_2650[1].dist = auVar47._0_4_;
                  local_2650 = local_2650 + 2;
                }
                else {
                  auVar50 = vpshufd_avx2(auVar52,0xff);
                  vpermt2q_avx512vl(auVar47,auVar50,auVar48);
                  auVar13 = vpminsd_avx2(auVar53,auVar50);
                  auVar50 = vpmaxsd_avx2(auVar53,auVar50);
                  auVar53 = vpminsd_avx2(auVar59,auVar50);
                  auVar50 = vpmaxsd_avx2(auVar59,auVar50);
                  auVar59 = vpminsd_avx2(auVar49,auVar50);
                  auVar49 = vpmaxsd_avx2(auVar49,auVar50);
                  uVar30 = uVar30 - 1 & uVar30;
                  if (uVar30 == 0) {
                    auVar50 = vpermi2q_avx512vl(auVar13,auVar47,auVar48);
                    sVar26 = auVar50._0_8_;
                    auVar50 = vpermt2q_avx512vl(auVar47,auVar49,auVar48);
                    (local_2650->ptr).ptr = auVar50._0_8_;
                    in_ZMM8 = ZEXT3264(auVar67);
                    auVar49 = vpermd_avx2(auVar49,auVar67);
                    local_2650->dist = auVar49._0_4_;
                    auVar49 = vpermt2q_avx512vl(auVar47,auVar59,auVar48);
                    local_2650[1].ptr.ptr = auVar49._0_8_;
                    auVar49 = vpermd_avx2(auVar59,auVar67);
                    local_2650[1].dist = auVar49._0_4_;
                    auVar47 = vpermt2q_avx512vl(auVar47,auVar53,auVar48);
                    local_2650[2].ptr.ptr = auVar47._0_8_;
                    auVar47 = vpermd_avx2(auVar53,auVar67);
                    local_2650[2].dist = auVar47._0_4_;
                    local_2650 = local_2650 + 3;
                  }
                  else {
                    auVar51 = valignd_avx512vl(auVar52,auVar52,3);
                    auVar50 = vmovdqa64_avx512vl(auVar82._0_32_);
                    auVar50 = vpermt2d_avx512vl(auVar50,auVar83._0_32_,auVar13);
                    auVar50 = vpermt2d_avx512vl(auVar50,auVar84._0_32_,auVar53);
                    auVar52 = vpermt2d_avx512vl(auVar50,auVar84._0_32_,auVar59);
                    auVar50 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                    auVar49 = vpermt2d_avx512vl(auVar52,auVar50,auVar49);
                    auVar60 = ZEXT3264(auVar49);
                    uVar25 = uVar30;
                    do {
                      auVar50 = auVar60._0_32_;
                      auVar59._8_4_ = 1;
                      auVar59._0_8_ = 0x100000001;
                      auVar59._12_4_ = 1;
                      auVar59._16_4_ = 1;
                      auVar59._20_4_ = 1;
                      auVar59._24_4_ = 1;
                      auVar59._28_4_ = 1;
                      auVar49 = vpermd_avx2(auVar59,auVar51);
                      auVar51 = valignd_avx512vl(auVar51,auVar51,1);
                      vpermt2q_avx512vl(auVar47,auVar51,auVar48);
                      uVar25 = uVar25 - 1 & uVar25;
                      uVar17 = vpcmpd_avx512vl(auVar49,auVar50,5);
                      auVar49 = vpmaxsd_avx2(auVar49,auVar50);
                      bVar24 = (byte)uVar17 << 1;
                      auVar50 = valignd_avx512vl(auVar50,auVar50,7);
                      bVar12 = (bool)((byte)uVar17 & 1);
                      auVar53._4_4_ = (uint)bVar12 * auVar50._4_4_ | (uint)!bVar12 * auVar49._4_4_;
                      auVar53._0_4_ = auVar49._0_4_;
                      bVar12 = (bool)(bVar24 >> 2 & 1);
                      auVar53._8_4_ = (uint)bVar12 * auVar50._8_4_ | (uint)!bVar12 * auVar49._8_4_;
                      bVar12 = (bool)(bVar24 >> 3 & 1);
                      auVar53._12_4_ =
                           (uint)bVar12 * auVar50._12_4_ | (uint)!bVar12 * auVar49._12_4_;
                      bVar12 = (bool)(bVar24 >> 4 & 1);
                      auVar53._16_4_ =
                           (uint)bVar12 * auVar50._16_4_ | (uint)!bVar12 * auVar49._16_4_;
                      bVar12 = (bool)(bVar24 >> 5 & 1);
                      auVar53._20_4_ =
                           (uint)bVar12 * auVar50._20_4_ | (uint)!bVar12 * auVar49._20_4_;
                      bVar12 = (bool)(bVar24 >> 6 & 1);
                      auVar53._24_4_ =
                           (uint)bVar12 * auVar50._24_4_ | (uint)!bVar12 * auVar49._24_4_;
                      auVar53._28_4_ =
                           (uint)(bVar24 >> 7) * auVar50._28_4_ |
                           (uint)!(bool)(bVar24 >> 7) * auVar49._28_4_;
                      auVar60 = ZEXT3264(auVar53);
                    } while (uVar25 != 0);
                    lVar28 = POPCOUNT(uVar30) + 3;
                    do {
                      auVar49 = vpermi2q_avx512vl(auVar53,auVar47,auVar48);
                      (local_2650->ptr).ptr = auVar49._0_8_;
                      auVar50 = auVar60._0_32_;
                      auVar49 = vpermd_avx2(auVar50,auVar67);
                      local_2650->dist = auVar49._0_4_;
                      auVar53 = valignd_avx512vl(auVar50,auVar50,1);
                      local_2650 = local_2650 + 1;
                      auVar60 = ZEXT3264(auVar53);
                      lVar28 = lVar28 + -1;
                    } while (lVar28 != 0);
                    auVar47 = vpermt2q_avx512vl(auVar47,auVar53,auVar48);
                    sVar26 = auVar47._0_8_;
                    in_ZMM8 = ZEXT3264(auVar67);
                  }
                }
              }
            }
          }
        }
        else {
          iVar22 = 6;
        }
      } while (iVar22 == 0);
    } while (iVar22 != 6);
    local_2630 = (ulong)((uint)sVar26 & 0xf) - 8;
    if (local_2630 != 0) {
      uVar27 = sVar26 & 0xfffffffffffffff0;
      lVar28 = 0;
      do {
        lVar23 = lVar28 * 0x50;
        pSVar2 = context->scene;
        ppfVar3 = (pSVar2->vertices).items;
        pfVar4 = ppfVar3[*(uint *)(uVar27 + 0x30 + lVar23)];
        pfVar5 = ppfVar3[*(uint *)(uVar27 + 0x34 + lVar23)];
        pfVar6 = ppfVar3[*(uint *)(uVar27 + 0x38 + lVar23)];
        pfVar7 = ppfVar3[*(uint *)(uVar27 + 0x3c + lVar23)];
        auVar44 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar27 + lVar23)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar27 + 8 + lVar23)));
        auVar33 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar27 + lVar23)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar27 + 8 + lVar23)));
        auVar64 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar27 + 4 + lVar23)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar27 + 0xc + lVar23)));
        auVar45 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar27 + 4 + lVar23)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar27 + 0xc + lVar23)));
        auVar39 = vunpcklps_avx(auVar33,auVar45);
        auVar36 = vunpcklps_avx(auVar44,auVar64);
        auVar37 = vunpckhps_avx(auVar44,auVar64);
        auVar44 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar27 + 0x10 + lVar23)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar27 + 0x18 + lVar23)));
        auVar33 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar27 + 0x10 + lVar23)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar27 + 0x18 + lVar23)));
        auVar64 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar27 + 0x14 + lVar23)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar27 + 0x1c + lVar23)));
        auVar45 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar27 + 0x14 + lVar23)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar27 + 0x1c + lVar23)));
        auVar42 = vunpcklps_avx(auVar33,auVar45);
        auVar35 = vunpcklps_avx(auVar44,auVar64);
        auVar45 = vunpckhps_avx(auVar44,auVar64);
        auVar64 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar27 + 0x20 + lVar23)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar27 + 0x28 + lVar23)));
        auVar33 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar4 + *(uint *)(uVar27 + 0x20 + lVar23)),
                                *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar27 + 0x28 + lVar23)));
        auVar43 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar27 + 0x24 + lVar23)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar27 + 0x2c + lVar23)));
        auVar44 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar27 + 0x24 + lVar23)),
                                *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar27 + 0x2c + lVar23)));
        auVar34 = vunpcklps_avx(auVar33,auVar44);
        auVar38 = vunpcklps_avx(auVar64,auVar43);
        puVar1 = (undefined8 *)(uVar27 + 0x30 + lVar23);
        local_2518 = *puVar1;
        uStack_2510 = puVar1[1];
        auVar43 = vunpckhps_avx(auVar64,auVar43);
        puVar1 = (undefined8 *)(uVar27 + 0x40 + lVar23);
        local_25f8 = *puVar1;
        uStack_25f0 = puVar1[1];
        auVar33 = vsubps_avx(auVar36,auVar35);
        auVar45 = vsubps_avx(auVar37,auVar45);
        auVar44 = vsubps_avx(auVar39,auVar42);
        auVar64 = vsubps_avx(auVar38,auVar36);
        auVar43 = vsubps_avx(auVar43,auVar37);
        auVar42 = vsubps_avx(auVar34,auVar39);
        auVar34._0_4_ = auVar45._0_4_ * auVar42._0_4_;
        auVar34._4_4_ = auVar45._4_4_ * auVar42._4_4_;
        auVar34._8_4_ = auVar45._8_4_ * auVar42._8_4_;
        auVar34._12_4_ = auVar45._12_4_ * auVar42._12_4_;
        local_2568 = vfmsub231ps_fma(auVar34,auVar43,auVar44);
        auVar38._0_4_ = auVar44._0_4_ * auVar64._0_4_;
        auVar38._4_4_ = auVar44._4_4_ * auVar64._4_4_;
        auVar38._8_4_ = auVar44._8_4_ * auVar64._8_4_;
        auVar38._12_4_ = auVar44._12_4_ * auVar64._12_4_;
        local_2558 = vfmsub231ps_fma(auVar38,auVar42,auVar33);
        auVar40._0_4_ = auVar33._0_4_ * auVar43._0_4_;
        auVar40._4_4_ = auVar33._4_4_ * auVar43._4_4_;
        auVar40._8_4_ = auVar33._8_4_ * auVar43._8_4_;
        auVar40._12_4_ = auVar33._12_4_ * auVar43._12_4_;
        uVar54 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar66._4_4_ = uVar54;
        auVar66._0_4_ = uVar54;
        auVar66._8_4_ = uVar54;
        auVar66._12_4_ = uVar54;
        fVar58 = *(float *)(ray + k * 4 + 0x50);
        auVar71._4_4_ = fVar58;
        auVar71._0_4_ = fVar58;
        auVar71._8_4_ = fVar58;
        auVar71._12_4_ = fVar58;
        auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
        uVar54 = *(undefined4 *)(ray + k * 4);
        auVar35._4_4_ = uVar54;
        auVar35._0_4_ = uVar54;
        auVar35._8_4_ = uVar54;
        auVar35._12_4_ = uVar54;
        auVar35 = vsubps_avx512vl(auVar36,auVar35);
        local_2548 = vfmsub231ps_fma(auVar40,auVar64,auVar45);
        uVar54 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar36._4_4_ = uVar54;
        auVar36._0_4_ = uVar54;
        auVar36._8_4_ = uVar54;
        auVar36._12_4_ = uVar54;
        auVar36 = vsubps_avx512vl(auVar37,auVar36);
        uVar54 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar37._4_4_ = uVar54;
        auVar37._0_4_ = uVar54;
        auVar37._8_4_ = uVar54;
        auVar37._12_4_ = uVar54;
        auVar37 = vsubps_avx512vl(auVar39,auVar37);
        auVar41._0_4_ = fVar58 * auVar37._0_4_;
        auVar41._4_4_ = fVar58 * auVar37._4_4_;
        auVar41._8_4_ = fVar58 * auVar37._8_4_;
        auVar41._12_4_ = fVar58 * auVar37._12_4_;
        auVar38 = vfmsub231ps_avx512vl(auVar41,auVar36,auVar34);
        auVar39 = vmulps_avx512vl(auVar34,auVar35);
        auVar40 = vfmsub231ps_avx512vl(auVar39,auVar37,auVar66);
        auVar39 = vmulps_avx512vl(auVar66,auVar36);
        auVar41 = vfmsub231ps_avx512vl(auVar39,auVar35,auVar71);
        auVar39 = vmulps_avx512vl(local_2548,auVar34);
        auVar39 = vfmadd231ps_avx512vl(auVar39,local_2558,auVar71);
        auVar34 = vfmadd231ps_avx512vl(auVar39,local_2568,auVar66);
        auVar39._8_4_ = 0x7fffffff;
        auVar39._0_8_ = 0x7fffffff7fffffff;
        auVar39._12_4_ = 0x7fffffff;
        local_25b8 = vandps_avx512vl(auVar34,auVar39);
        auVar39 = vandps_avx512vl(auVar34,auVar82._0_16_);
        auVar42 = vmulps_avx512vl(auVar42,auVar41);
        auVar43 = vfmadd231ps_avx512vl(auVar42,auVar40,auVar43);
        auVar64 = vfmadd231ps_fma(auVar43,auVar38,auVar64);
        uVar65 = auVar39._0_4_;
        local_25e8._0_4_ = (float)(uVar65 ^ auVar64._0_4_);
        uVar68 = auVar39._4_4_;
        local_25e8._4_4_ = (float)(uVar68 ^ auVar64._4_4_);
        uVar69 = auVar39._8_4_;
        local_25e8._8_4_ = (float)(uVar69 ^ auVar64._8_4_);
        uVar70 = auVar39._12_4_;
        local_25e8._12_4_ = (float)(uVar70 ^ auVar64._12_4_);
        auVar44 = vmulps_avx512vl(auVar44,auVar41);
        auVar45 = vfmadd231ps_avx512vl(auVar44,auVar45,auVar40);
        auVar33 = vfmadd231ps_fma(auVar45,auVar33,auVar38);
        local_25d8._0_4_ = (float)(uVar65 ^ auVar33._0_4_);
        local_25d8._4_4_ = (float)(uVar68 ^ auVar33._4_4_);
        local_25d8._8_4_ = (float)(uVar69 ^ auVar33._8_4_);
        local_25d8._12_4_ = (float)(uVar70 ^ auVar33._12_4_);
        auVar33 = ZEXT816(0) << 0x20;
        uVar17 = vcmpps_avx512vl(local_25e8,auVar33,5);
        uVar14 = vcmpps_avx512vl(local_25d8,auVar33,5);
        uVar15 = vcmpps_avx512vl(auVar34,auVar33,4);
        auVar33._0_4_ = local_25d8._0_4_ + local_25e8._0_4_;
        auVar33._4_4_ = local_25d8._4_4_ + local_25e8._4_4_;
        auVar33._8_4_ = local_25d8._8_4_ + local_25e8._8_4_;
        auVar33._12_4_ = local_25d8._12_4_ + local_25e8._12_4_;
        uVar16 = vcmpps_avx512vl(auVar33,local_25b8,2);
        local_25a7 = (byte)uVar17 & (byte)uVar14 & (byte)uVar15 & (byte)uVar16;
        if (local_25a7 != 0) {
          auVar64._0_4_ = local_2548._0_4_ * auVar37._0_4_;
          auVar64._4_4_ = local_2548._4_4_ * auVar37._4_4_;
          auVar64._8_4_ = local_2548._8_4_ * auVar37._8_4_;
          auVar64._12_4_ = local_2548._12_4_ * auVar37._12_4_;
          auVar33 = vfmadd213ps_fma(auVar36,local_2558,auVar64);
          auVar33 = vfmadd213ps_fma(auVar35,local_2568,auVar33);
          local_25c8._0_4_ = (float)(uVar65 ^ auVar33._0_4_);
          local_25c8._4_4_ = (float)(uVar68 ^ auVar33._4_4_);
          local_25c8._8_4_ = (float)(uVar69 ^ auVar33._8_4_);
          local_25c8._12_4_ = (float)(uVar70 ^ auVar33._12_4_);
          uVar54 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar45._4_4_ = uVar54;
          auVar45._0_4_ = uVar54;
          auVar45._8_4_ = uVar54;
          auVar45._12_4_ = uVar54;
          auVar33 = vmulps_avx512vl(local_25b8,auVar45);
          uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar44._4_4_ = uVar54;
          auVar44._0_4_ = uVar54;
          auVar44._8_4_ = uVar54;
          auVar44._12_4_ = uVar54;
          auVar45 = vmulps_avx512vl(local_25b8,auVar44);
          uVar17 = vcmpps_avx512vl(local_25c8,auVar45,2);
          uVar14 = vcmpps_avx512vl(auVar33,local_25c8,1);
          local_25a7 = (byte)uVar17 & (byte)uVar14 & local_25a7;
          uVar31 = (ulong)local_25a7;
          if (local_25a7 != 0) {
            auVar33 = vrcp14ps_avx512vl(local_25b8);
            auVar43._8_4_ = 0x3f800000;
            auVar43._0_8_ = &DAT_3f8000003f800000;
            auVar43._12_4_ = 0x3f800000;
            auVar45 = vfnmadd213ps_avx512vl(local_25b8,auVar33,auVar43);
            auVar33 = vfmadd132ps_fma(auVar45,auVar33,auVar33);
            fVar58 = auVar33._0_4_;
            local_2578._0_4_ = fVar58 * local_25c8._0_4_;
            fVar61 = auVar33._4_4_;
            local_2578._4_4_ = fVar61 * local_25c8._4_4_;
            fVar62 = auVar33._8_4_;
            local_2578._8_4_ = fVar62 * local_25c8._8_4_;
            fVar63 = auVar33._12_4_;
            local_2578._12_4_ = fVar63 * local_25c8._12_4_;
            auVar57 = ZEXT1664(local_2578);
            local_2598[0] = fVar58 * local_25e8._0_4_;
            local_2598[1] = fVar61 * local_25e8._4_4_;
            local_2598[2] = fVar62 * local_25e8._8_4_;
            local_2598[3] = fVar63 * local_25e8._12_4_;
            local_2588[0] = fVar58 * local_25d8._0_4_;
            local_2588[1] = fVar61 * local_25d8._4_4_;
            local_2588[2] = fVar62 * local_25d8._8_4_;
            local_2588[3] = fVar63 * local_25d8._12_4_;
            auVar55._8_4_ = 0x7f800000;
            auVar55._0_8_ = 0x7f8000007f800000;
            auVar55._12_4_ = 0x7f800000;
            auVar33 = vblendmps_avx512vl(auVar55,local_2578);
            auVar42._0_4_ =
                 (uint)(local_25a7 & 1) * auVar33._0_4_ | (uint)!(bool)(local_25a7 & 1) * 0x7f800000
            ;
            bVar12 = (bool)(local_25a7 >> 1 & 1);
            auVar42._4_4_ = (uint)bVar12 * auVar33._4_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(local_25a7 >> 2 & 1);
            auVar42._8_4_ = (uint)bVar12 * auVar33._8_4_ | (uint)!bVar12 * 0x7f800000;
            bVar12 = (bool)(local_25a7 >> 3 & 1);
            auVar42._12_4_ = (uint)bVar12 * auVar33._12_4_ | (uint)!bVar12 * 0x7f800000;
            auVar33 = vshufps_avx(auVar42,auVar42,0xb1);
            auVar33 = vminps_avx(auVar33,auVar42);
            auVar45 = vshufpd_avx(auVar33,auVar33,1);
            auVar33 = vminps_avx(auVar45,auVar33);
            uVar17 = vcmpps_avx512vl(auVar42,auVar33,0);
            bVar24 = (byte)uVar17 & local_25a7;
            if (((byte)uVar17 & local_25a7) == 0) {
              bVar24 = local_25a7;
            }
            local_2668 = 0;
            for (uVar32 = (ulong)bVar24; (uVar32 & 1) == 0;
                uVar32 = uVar32 >> 1 | 0x8000000000000000) {
              local_2668 = local_2668 + 1;
            }
            do {
              uVar65 = *(uint *)((long)&local_2518 + local_2668 * 4);
              pGVar8 = (pSVar2->geometries).items[uVar65].ptr;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                uVar31 = (ulong)(byte)(~(byte)(1 << ((uint)local_2668 & 0x1f)) & (byte)uVar31);
                bVar12 = true;
              }
              else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                      (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                bVar12 = false;
              }
              else {
                local_2538 = auVar57._0_16_;
                auVar47 = vmovdqu64_avx512vl(auVar78._0_32_);
                fVar58 = local_2598[local_2668];
                h.u.field_0.i[1] = (int)fVar58;
                h.u.field_0.i[0] = (int)fVar58;
                h.u.field_0.i[2] = (int)fVar58;
                h.u.field_0.i[3] = (int)fVar58;
                h.v.field_0.v[0] = local_2588[local_2668];
                h.geomID.field_0 =
                     (anon_union_16_2_9473010e_for_vuint_impl<4>_1)vpbroadcastd_avx512vl();
                uVar54 = *(undefined4 *)((long)&local_25f8 + local_2668 * 4);
                h.primID.field_0.i[1] = uVar54;
                h.primID.field_0.i[0] = uVar54;
                h.primID.field_0.i[2] = uVar54;
                h.primID.field_0.i[3] = uVar54;
                h.Ng.field_0._0_4_ = *(undefined4 *)(local_2568 + local_2668 * 4);
                uVar54 = *(undefined4 *)(local_2558 + local_2668 * 4);
                h.Ng.field_0._20_4_ = uVar54;
                h.Ng.field_0._16_4_ = uVar54;
                h.Ng.field_0._24_4_ = uVar54;
                h.Ng.field_0._28_4_ = uVar54;
                uVar54 = *(undefined4 *)(local_2548 + local_2668 * 4);
                h.Ng.field_0._36_4_ = uVar54;
                h.Ng.field_0._32_4_ = uVar54;
                h.Ng.field_0._40_4_ = uVar54;
                h.Ng.field_0._44_4_ = uVar54;
                h.Ng.field_0._4_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._8_4_ = h.Ng.field_0._0_4_;
                h.Ng.field_0._12_4_ = h.Ng.field_0._0_4_;
                h.v.field_0.v[1] = h.v.field_0.v[0];
                h.v.field_0.v[2] = h.v.field_0.v[0];
                h.v.field_0.v[3] = h.v.field_0.v[0];
                vpcmpeqd_avx2(ZEXT1632((undefined1  [16])h.u.field_0),
                              ZEXT1632((undefined1  [16])h.u.field_0));
                h.instID[0].field_0.i[1] = context->user->instID[0];
                h.instID[0].field_0.i[0] = h.instID[0].field_0.i[1];
                h.instID[0].field_0.i[2] = h.instID[0].field_0.i[1];
                h.instID[0].field_0.i[3] = h.instID[0].field_0.i[1];
                h.instPrimID[0].field_0.i[0] = context->user->instPrimID[0];
                h.instPrimID[0].field_0.i[1] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[2] = h.instPrimID[0].field_0.i[0];
                h.instPrimID[0].field_0.i[3] = h.instPrimID[0].field_0.i[0];
                uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2578 + local_2668 * 4);
                local_2528 = vmovdqa64_avx512vl(auVar79._0_16_);
                local_2678 = vmovdqa64_avx512vl(auVar79._0_16_);
                args.valid = (int *)local_2678;
                args.geometryUserPtr = pGVar8->userPtr;
                args.context = context->user;
                args.hit = (RTCHitN *)&h;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar8->intersectionFilterN)(&args);
                }
                uVar32 = vptestmd_avx512vl(local_2678,local_2678);
                if ((uVar32 & 0xf) == 0) {
LAB_00833ac8:
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar54;
                }
                else {
                  p_Var9 = context->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var9)(&args);
                  }
                  uVar32 = vptestmd_avx512vl(local_2678,local_2678);
                  uVar32 = uVar32 & 0xf;
                  bVar24 = (byte)uVar32;
                  if (bVar24 == 0) goto LAB_00833ac8;
                  iVar22 = *(int *)(args.hit + 4);
                  iVar21 = *(int *)(args.hit + 8);
                  iVar19 = *(int *)(args.hit + 0xc);
                  bVar12 = (bool)((byte)(uVar32 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  bVar11 = SUB81(uVar32 >> 3,0);
                  *(uint *)(args.ray + 0xc0) =
                       (uint)(bVar24 & 1) * *(int *)args.hit |
                       (uint)!(bool)(bVar24 & 1) * *(uint *)(args.ray + 0xc0);
                  *(uint *)(args.ray + 0xc4) =
                       (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(args.ray + 0xc4);
                  *(uint *)(args.ray + 200) =
                       (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(args.ray + 200);
                  *(uint *)(args.ray + 0xcc) =
                       (uint)bVar11 * iVar19 | (uint)!bVar11 * *(int *)(args.ray + 0xcc);
                  iVar22 = *(int *)(args.hit + 0x14);
                  iVar21 = *(int *)(args.hit + 0x18);
                  iVar19 = *(int *)(args.hit + 0x1c);
                  bVar12 = (bool)((byte)(uVar32 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  bVar11 = SUB81(uVar32 >> 3,0);
                  *(uint *)(args.ray + 0xd0) =
                       (uint)(bVar24 & 1) * *(int *)(args.hit + 0x10) |
                       (uint)!(bool)(bVar24 & 1) * *(uint *)(args.ray + 0xd0);
                  *(uint *)(args.ray + 0xd4) =
                       (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(args.ray + 0xd4);
                  *(uint *)(args.ray + 0xd8) =
                       (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(args.ray + 0xd8);
                  *(uint *)(args.ray + 0xdc) =
                       (uint)bVar11 * iVar19 | (uint)!bVar11 * *(int *)(args.ray + 0xdc);
                  iVar22 = *(int *)(args.hit + 0x24);
                  iVar21 = *(int *)(args.hit + 0x28);
                  iVar19 = *(int *)(args.hit + 0x2c);
                  bVar12 = (bool)((byte)(uVar32 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  bVar11 = SUB81(uVar32 >> 3,0);
                  *(uint *)(args.ray + 0xe0) =
                       (uint)(bVar24 & 1) * *(int *)(args.hit + 0x20) |
                       (uint)!(bool)(bVar24 & 1) * *(uint *)(args.ray + 0xe0);
                  *(uint *)(args.ray + 0xe4) =
                       (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(args.ray + 0xe4);
                  *(uint *)(args.ray + 0xe8) =
                       (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(args.ray + 0xe8);
                  *(uint *)(args.ray + 0xec) =
                       (uint)bVar11 * iVar19 | (uint)!bVar11 * *(int *)(args.ray + 0xec);
                  iVar22 = *(int *)(args.hit + 0x34);
                  iVar21 = *(int *)(args.hit + 0x38);
                  iVar19 = *(int *)(args.hit + 0x3c);
                  bVar12 = (bool)((byte)(uVar32 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  bVar11 = SUB81(uVar32 >> 3,0);
                  *(uint *)(args.ray + 0xf0) =
                       (uint)(bVar24 & 1) * *(int *)(args.hit + 0x30) |
                       (uint)!(bool)(bVar24 & 1) * *(uint *)(args.ray + 0xf0);
                  *(uint *)(args.ray + 0xf4) =
                       (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(args.ray + 0xf4);
                  *(uint *)(args.ray + 0xf8) =
                       (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(args.ray + 0xf8);
                  *(uint *)(args.ray + 0xfc) =
                       (uint)bVar11 * iVar19 | (uint)!bVar11 * *(int *)(args.ray + 0xfc);
                  iVar22 = *(int *)(args.hit + 0x44);
                  iVar21 = *(int *)(args.hit + 0x48);
                  iVar19 = *(int *)(args.hit + 0x4c);
                  bVar12 = (bool)((byte)(uVar32 >> 1) & 1);
                  bVar10 = (bool)((byte)(uVar32 >> 2) & 1);
                  bVar11 = SUB81(uVar32 >> 3,0);
                  *(uint *)(args.ray + 0x100) =
                       (uint)(bVar24 & 1) * *(int *)(args.hit + 0x40) |
                       (uint)!(bool)(bVar24 & 1) * *(uint *)(args.ray + 0x100);
                  *(uint *)(args.ray + 0x104) =
                       (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(args.ray + 0x104);
                  *(uint *)(args.ray + 0x108) =
                       (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(args.ray + 0x108);
                  *(uint *)(args.ray + 0x10c) =
                       (uint)bVar11 * iVar19 | (uint)!bVar11 * *(int *)(args.ray + 0x10c);
                  auVar33 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar33;
                  auVar33 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar33;
                  auVar33 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar33;
                  auVar33 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar33;
                }
                auVar57 = ZEXT1664(local_2538);
                uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar18._4_4_ = uVar54;
                auVar18._0_4_ = uVar54;
                auVar18._8_4_ = uVar54;
                auVar18._12_4_ = uVar54;
                uVar17 = vcmpps_avx512vl(local_2538,auVar18,2);
                uVar31 = (ulong)(byte)(~(byte)(1 << ((uint)local_2668 & 0x1f)) & (byte)uVar31 &
                                      (byte)uVar17);
                bVar12 = true;
                auVar72 = ZEXT3264(auVar72._0_32_);
                auVar73 = ZEXT3264(auVar73._0_32_);
                auVar74 = ZEXT3264(auVar74._0_32_);
                auVar75 = ZEXT3264(auVar75._0_32_);
                auVar76 = ZEXT3264(auVar76._0_32_);
                auVar77 = ZEXT3264(auVar77._0_32_);
                auVar47 = vmovdqu64_avx512vl(auVar47);
                auVar78 = ZEXT3264(auVar47);
                auVar33 = vmovdqa64_avx512vl(local_2528);
                auVar79 = ZEXT1664(auVar33);
                auVar47 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                auVar80 = ZEXT3264(auVar47);
                auVar47 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                auVar81 = ZEXT3264(auVar47);
                auVar33 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar82 = ZEXT1664(auVar33);
                auVar47 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                auVar83 = ZEXT3264(auVar47);
                auVar47 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
                auVar84 = ZEXT3264(auVar47);
              }
              if (!bVar12) {
                fVar58 = local_2598[local_2668];
                fVar61 = local_2588[local_2668];
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2578 + local_2668 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2568 + local_2668 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2558 + local_2668 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_2548 + local_2668 * 4);
                *(float *)(ray + k * 4 + 0xf0) = fVar58;
                *(float *)(ray + k * 4 + 0x100) = fVar61;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_25f8 + local_2668 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar65;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                break;
              }
              bVar24 = (byte)uVar31;
              if (bVar24 == 0) break;
              auVar56._8_4_ = 0x7f800000;
              auVar56._0_8_ = 0x7f8000007f800000;
              auVar56._12_4_ = 0x7f800000;
              auVar33 = vblendmps_avx512vl(auVar56,auVar57._0_16_);
              auVar46._0_4_ =
                   (uint)(bVar24 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar24 & 1) * 0x7f800000;
              bVar12 = (bool)((byte)(uVar31 >> 1) & 1);
              auVar46._4_4_ = (uint)bVar12 * auVar33._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)((byte)(uVar31 >> 2) & 1);
              auVar46._8_4_ = (uint)bVar12 * auVar33._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)((byte)(uVar31 >> 3) & 1);
              auVar46._12_4_ = (uint)bVar12 * auVar33._12_4_ | (uint)!bVar12 * 0x7f800000;
              auVar33 = vshufps_avx(auVar46,auVar46,0xb1);
              auVar33 = vminps_avx(auVar33,auVar46);
              auVar45 = vshufpd_avx(auVar33,auVar33,1);
              auVar33 = vminps_avx(auVar45,auVar33);
              uVar17 = vcmpps_avx512vl(auVar46,auVar33,0);
              bVar24 = (byte)uVar17 & bVar24;
              uVar65 = (uint)uVar31;
              if (bVar24 != 0) {
                uVar65 = (uint)bVar24;
              }
              uVar68 = 0;
              for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                uVar68 = uVar68 + 1;
              }
              local_2668 = (ulong)uVar68;
            } while( true );
          }
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != local_2630);
    }
    uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar57 = ZEXT3264(CONCAT428(uVar54,CONCAT424(uVar54,CONCAT420(uVar54,CONCAT416(uVar54,CONCAT412
                                                  (uVar54,CONCAT48(uVar54,CONCAT44(uVar54,uVar54))))
                                                  ))));
    in_ZMM8 = ZEXT3264(in_ZMM8._0_32_);
    uVar27 = local_2638;
    uVar31 = local_2640;
    uVar32 = local_2648;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }